

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O2

void __thiscall glslang::TFunction::addThisParameter(TFunction *this,TType *type,char *name)

{
  TType *pTVar1;
  TParameter p;
  
  pTVar1 = type;
  p.name = NewPoolTString_abi_cxx11_(name);
  pTVar1 = (TType *)TType::operator_new((TType *)0x98,(size_t)pTVar1);
  TType::TType(pTVar1,EbtVoid,EvqTemporary,1,0,0,false);
  p.defaultValue = (TIntermTyped *)0x0;
  p.type = pTVar1;
  TType::shallowCopy(pTVar1,type);
  std::vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>::insert
            (&(this->parameters).
              super_vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>,
             (this->parameters).
             super_vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>.
             super__Vector_base<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>.
             _M_impl.super__Vector_impl_data._M_start,&p);
  return;
}

Assistant:

virtual void addThisParameter(TType& type, const char* name)
    {
        TParameter p = { NewPoolTString(name), new TType, nullptr };
        p.type->shallowCopy(type);
        parameters.insert(parameters.begin(), p);
    }